

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq1_m(block_iq1_m *x,float *y,int64_t k)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 uVar4;
  long lVar5;
  sbyte sVar6;
  int l;
  long lVar7;
  long lVar8;
  int ib;
  uint uVar9;
  int j;
  long lVar10;
  uint8_t *puVar11;
  block_iq1_m *pbVar12;
  undefined1 auVar13 [16];
  float local_48 [4];
  ulong local_38;
  float delta [4];
  
  lVar8 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar8;
  }
  for (; lVar8 != lVar5; lVar8 = lVar8 + 1) {
    puVar11 = x[lVar8].qh;
    fVar1 = ggml_table_f32_f16
            [*(ushort *)(x[lVar8].scales + 6) & 0xf000 |
             *(ushort *)(x[lVar8].scales + 4) >> 4 & 0xf00 |
             x[lVar8].scales[3] & 0xfffffff0 | (uint)(*(ushort *)x[lVar8].scales >> 0xc)];
    pbVar12 = x + lVar8;
    for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
      uVar2 = *(ushort *)(x[lVar8].scales + (uVar9 & 0xfffffffe));
      sVar6 = 0;
      if ((uVar9 & 1) != 0) {
        sVar6 = 6;
      }
      uVar3 = *(ushort *)puVar11;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (ulong)CONCAT12((char)(uVar3 >> 8),uVar3) & 0xffffffffffff00ff;
      auVar13 = pshuflw(auVar13,auVar13,0x50);
      uVar4 = *(undefined4 *)pbVar12->qs;
      local_38 = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar4 >> 0x10),uVar4)) >>
                                                  0x20),uVar4) >> 0x18),
                                                 CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4)) >>
                                       0x10),(short)uVar4) & 0xffff00ff00ff00ff |
                 CONCAT26(auVar13._6_2_ * 0x10,
                          CONCAT24(auVar13._4_2_ * 0x100,
                                   CONCAT22(auVar13._2_2_ * 0x10,auVar13._0_2_ * 0x100))) &
                 0x700070007000700;
      local_48[0] = 0.125;
      if ((uVar3 & 8) != 0) {
        local_48[0] = -0.125;
      }
      local_48[1] = 0.125;
      if ((char)uVar3 < '\0') {
        local_48[1] = -0.125;
      }
      local_48[2] = 0.125;
      if ((uVar3 >> 8 & 8) != 0) {
        local_48[2] = -0.125;
      }
      local_48[3] = 0.125;
      if ((short)uVar3 < 0) {
        local_48[3] = -0.125;
      }
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        uVar3 = *(ushort *)((long)&local_38 + lVar7 * 2);
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          y[lVar10] = ((float)(int)*(char *)((long)iq1s_grid + lVar10 + (ulong)uVar3 * 8) +
                      local_48[lVar7]) * (float)(ushort)((uVar2 >> sVar6 & 7) * 2 + 1) * fVar1;
        }
        y = y + 8;
      }
      for (lVar7 = 2; lVar7 != 4; lVar7 = lVar7 + 1) {
        uVar3 = *(ushort *)((long)&local_38 + lVar7 * 2);
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          y[lVar10] = ((float)(int)*(char *)((long)iq1s_grid + lVar10 + (ulong)uVar3 * 8) +
                      local_48[lVar7]) * (float)(ushort)((uVar2 >> sVar6 + 3 & 7) * 2 + 1) * fVar1;
        }
        y = y + 8;
      }
      pbVar12 = (block_iq1_m *)(pbVar12->qs + 4);
      puVar11 = puVar11 + 2;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq1_m(const block_iq1_m * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float delta[4];
    uint16_t idx[4];

    iq1m_scale_t scale;

    for (int i = 0; i < nb; i++) {

        const uint16_t * sc = (const uint16_t *)x[i].scales;
        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
        const float d = GGML_FP16_TO_FP32(scale.f16);

        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float dl1 = d * (2*((sc[ib/2] >> (6*(ib%2)+0)) & 0x7) + 1);
            const float dl2 = d * (2*((sc[ib/2] >> (6*(ib%2)+3)) & 0x7) + 1);

            idx[0] = qs[0] | ((qh[0] << 8) & 0x700);
            idx[1] = qs[1] | ((qh[0] << 4) & 0x700);
            idx[2] = qs[2] | ((qh[1] << 8) & 0x700);
            idx[3] = qs[3] | ((qh[1] << 4) & 0x700);
            delta[0] = qh[0] & 0x08 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[1] = qh[0] & 0x80 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[2] = qh[1] & 0x08 ? -IQ1S_DELTA : IQ1S_DELTA;
            delta[3] = qh[1] & 0x80 ? -IQ1S_DELTA : IQ1S_DELTA;
            for (int l = 0; l < 2; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + idx[l]);
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl1 * (grid[j] + delta[l]);
                }
                y += 8;
            }
            for (int l = 2; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + idx[l]);
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl2 * (grid[j] + delta[l]);
                }
                y += 8;
            }
            qs += 4;
            qh += 2;
        }
    }
}